

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ref.c
# Opt level: O3

int run_test_pipe_ref2(void)

{
  uv_idle_t *handle;
  int iVar1;
  int extraout_EAX;
  uv_loop_t *puVar2;
  uv_loop_t *puVar3;
  uv_handle_t *handle_00;
  int64_t eval_b;
  int64_t eval_a;
  uv_pipe_t h;
  undefined1 auStack_588 [8];
  uv_idle_t uStack_580;
  uv_loop_t *puStack_528;
  long lStack_520;
  long lStack_518;
  uv_loop_t *puStack_510;
  char *pcStack_508;
  undefined8 uStack_500;
  size_t sStack_4f0;
  uv_process_options_t uStack_4e8;
  uv_process_t auStack_498 [3];
  uv_loop_t *puStack_328;
  undefined1 auStack_300 [496];
  uv_loop_t *puStack_110;
  void *local_100;
  void *local_f8;
  uv_pipe_t local_f0;
  
  puStack_110 = (uv_loop_t *)0x1b630a;
  puVar2 = uv_default_loop();
  puStack_110 = (uv_loop_t *)0x1b631c;
  uv_pipe_init(puVar2,&local_f0,0);
  puStack_110 = (uv_loop_t *)0x1b6330;
  uv_listen((uv_stream_t *)&local_f0,0x80,fail_cb);
  puStack_110 = (uv_loop_t *)0x1b6338;
  uv_unref((uv_handle_t *)&local_f0);
  puStack_110 = (uv_loop_t *)0x1b633d;
  puVar2 = uv_default_loop();
  puStack_110 = (uv_loop_t *)0x1b6347;
  uv_run(puVar2,UV_RUN_DEFAULT);
  puStack_110 = (uv_loop_t *)0x1b634f;
  do_close(&local_f0);
  puStack_110 = (uv_loop_t *)0x1b6354;
  puVar2 = uv_default_loop();
  puStack_110 = (uv_loop_t *)0x1b6368;
  uv_walk(puVar2,close_walk_cb,(void *)0x0);
  puStack_110 = (uv_loop_t *)0x1b6372;
  uv_run(puVar2,UV_RUN_DEFAULT);
  local_f8 = (void *)0x0;
  puStack_110 = (uv_loop_t *)0x1b6380;
  puVar3 = uv_default_loop();
  puStack_110 = (uv_loop_t *)0x1b6388;
  iVar1 = uv_loop_close(puVar3);
  local_100 = (void *)(long)iVar1;
  if (local_f8 == local_100) {
    puStack_110 = (uv_loop_t *)0x1b63a0;
    uv_library_shutdown();
    return 0;
  }
  puStack_110 = (uv_loop_t *)run_test_pipe_ref3;
  run_test_pipe_ref2_cold_1();
  auStack_300._232_8_ = (uv__queue *)0x1b63c7;
  puStack_110 = puVar2;
  puVar3 = uv_default_loop();
  puVar2 = (uv_loop_t *)(auStack_300 + 0x108);
  auStack_300._232_8_ = (uv__queue *)0x1b63d9;
  uv_pipe_init(puVar3,(uv_pipe_t *)puVar2,0);
  auStack_300._232_8_ = (uv__queue *)0x1b63f6;
  uv_pipe_connect(&connect_req,(uv_pipe_t *)puVar2,"/tmp/uv-test-sock",connect_and_shutdown);
  auStack_300._232_8_ = (uv__queue *)0x1b63fe;
  uv_unref((uv_handle_t *)puVar2);
  auStack_300._232_8_ = (uv__queue *)0x1b6403;
  puVar3 = uv_default_loop();
  auStack_300._232_8_ = (uv__queue *)0x1b640d;
  uv_run(puVar3,UV_RUN_DEFAULT);
  auStack_300._256_8_ = (uv_handle_t *)0x1;
  auStack_300._248_8_ = SEXT48(connect_cb_called);
  if ((uv_handle_t *)auStack_300._248_8_ == (uv_handle_t *)0x1) {
    auStack_300._256_8_ = (uv_handle_t *)0x1;
    auStack_300._248_8_ = SEXT48(shutdown_cb_called);
    if ((uv_handle_t *)auStack_300._248_8_ != (uv_handle_t *)0x1) goto LAB_001b64c8;
    auStack_300._232_8_ = (uv__queue *)0x1b645d;
    do_close(auStack_300 + 0x108);
    auStack_300._232_8_ = (uv__queue *)0x1b6462;
    puVar2 = uv_default_loop();
    auStack_300._232_8_ = (uv__queue *)0x1b6476;
    uv_walk(puVar2,close_walk_cb,(void *)0x0);
    auStack_300._232_8_ = (uv__queue *)0x1b6480;
    uv_run(puVar2,UV_RUN_DEFAULT);
    auStack_300._256_8_ = (uv_handle_t *)0x0;
    auStack_300._232_8_ = (uv__queue *)0x1b648e;
    puVar3 = uv_default_loop();
    auStack_300._232_8_ = (uv__queue *)0x1b6496;
    iVar1 = uv_loop_close(puVar3);
    auStack_300._248_8_ = SEXT48(iVar1);
    if (auStack_300._256_8_ == auStack_300._248_8_) {
      auStack_300._232_8_ = (uv__queue *)0x1b64ae;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    auStack_300._232_8_ = (uv__queue *)0x1b64c8;
    run_test_pipe_ref3_cold_1();
LAB_001b64c8:
    auStack_300._232_8_ = (uv__queue *)0x1b64d7;
    run_test_pipe_ref3_cold_2();
  }
  auStack_300._232_8_ = run_test_pipe_ref4;
  run_test_pipe_ref3_cold_3();
  auStack_300._232_8_ = puVar2;
  puVar3 = uv_default_loop();
  puVar2 = (uv_loop_t *)auStack_300;
  uv_pipe_init(puVar3,(uv_pipe_t *)puVar2,0);
  uv_pipe_connect(&connect_req,(uv_pipe_t *)puVar2,"/tmp/uv-test-sock",connect_and_write);
  uv_unref((uv_handle_t *)puVar2);
  puVar3 = uv_default_loop();
  uv_run(puVar3,UV_RUN_DEFAULT);
  if (connect_cb_called == 1) {
    if (write_cb_called != 1) goto LAB_001b661d;
    if (shutdown_cb_called != 1) goto LAB_001b662c;
    do_close(auStack_300);
    puVar2 = uv_default_loop();
    uv_walk(puVar2,close_walk_cb,(void *)0x0);
    uv_run(puVar2,UV_RUN_DEFAULT);
    puVar3 = uv_default_loop();
    iVar1 = uv_loop_close(puVar3);
    if (iVar1 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_pipe_ref4_cold_1();
LAB_001b661d:
    run_test_pipe_ref4_cold_2();
LAB_001b662c:
    run_test_pipe_ref4_cold_3();
  }
  run_test_pipe_ref4_cold_4();
  uStack_500 = 0;
  puStack_510 = (uv_loop_t *)0x0;
  pcStack_508 = "spawn_helper4";
  uStack_4e8.env = (char **)0x0;
  uStack_4e8.cwd = (char *)0x0;
  uStack_4e8.flags = 0;
  uStack_4e8.stdio_count = 0;
  uStack_4e8.stdio = (uv_stdio_container_t *)0x0;
  uStack_4e8.uid = 0;
  uStack_4e8.gid = 0;
  uStack_4e8.cpumask = (char *)0x0;
  uStack_4e8.cpumask_size = 0;
  sStack_4f0 = 0x100;
  puVar3 = (uv_loop_t *)(auStack_498 + 1);
  puStack_528 = (uv_loop_t *)0x1b66a5;
  puStack_328 = puVar2;
  iVar1 = uv_exepath((char *)puVar3,&sStack_4f0);
  auStack_498[0].data = (void *)(long)iVar1;
  lStack_520 = 0;
  if (auStack_498[0].data == (void *)0x0) {
    uStack_4e8.args = (char **)&puStack_510;
    uStack_4e8.exit_cb = (uv_exit_cb)0x0;
    puStack_528 = (uv_loop_t *)0x1b66e4;
    puStack_510 = puVar3;
    uStack_4e8.file = (char *)puVar3;
    puVar2 = uv_default_loop();
    puStack_528 = (uv_loop_t *)0x1b66f7;
    iVar1 = uv_spawn(puVar2,auStack_498,&uStack_4e8);
    lStack_520 = (long)iVar1;
    lStack_518 = 0;
    puVar3 = (uv_loop_t *)0x0;
    if (lStack_520 != 0) goto LAB_001b67d4;
    puVar3 = (uv_loop_t *)auStack_498;
    puStack_528 = (uv_loop_t *)0x1b6721;
    uv_unref((uv_handle_t *)puVar3);
    puStack_528 = (uv_loop_t *)0x1b6726;
    puVar2 = uv_default_loop();
    puStack_528 = (uv_loop_t *)0x1b6730;
    uv_run(puVar2,UV_RUN_DEFAULT);
    puStack_528 = (uv_loop_t *)0x1b673d;
    iVar1 = uv_process_kill((uv_process_t *)puVar3,0xf);
    lStack_520 = (long)iVar1;
    lStack_518 = 0;
    if (lStack_520 != 0) goto LAB_001b67e1;
    puStack_528 = (uv_loop_t *)0x1b6768;
    do_close(auStack_498);
    puStack_528 = (uv_loop_t *)0x1b676d;
    puVar3 = uv_default_loop();
    puStack_528 = (uv_loop_t *)0x1b6781;
    uv_walk(puVar3,close_walk_cb,(void *)0x0);
    puStack_528 = (uv_loop_t *)0x1b678b;
    uv_run(puVar3,UV_RUN_DEFAULT);
    lStack_520 = 0;
    puStack_528 = (uv_loop_t *)0x1b6798;
    puVar2 = uv_default_loop();
    puStack_528 = (uv_loop_t *)0x1b67a0;
    iVar1 = uv_loop_close(puVar2);
    lStack_518 = (long)iVar1;
    if (lStack_520 == lStack_518) {
      puStack_528 = (uv_loop_t *)0x1b67b7;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_528 = (uv_loop_t *)0x1b67d4;
    run_test_process_ref_cold_1();
LAB_001b67d4:
    puStack_528 = (uv_loop_t *)0x1b67e1;
    run_test_process_ref_cold_2();
LAB_001b67e1:
    puStack_528 = (uv_loop_t *)0x1b67ee;
    run_test_process_ref_cold_3();
  }
  puStack_528 = (uv_loop_t *)run_test_has_ref;
  run_test_process_ref_cold_4();
  puStack_528 = puVar3;
  puVar2 = uv_default_loop();
  handle = (uv_idle_t *)(auStack_588 + 8);
  uv_idle_init(puVar2,handle);
  uv_ref((uv_handle_t *)handle);
  auStack_588 = (undefined1  [8])0x1;
  iVar1 = uv_has_ref((uv_handle_t *)handle);
  if (auStack_588 == (undefined1  [8])(long)iVar1) {
    uv_unref((uv_handle_t *)(auStack_588 + 8));
    iVar1 = uv_has_ref((uv_handle_t *)(auStack_588 + 8));
    auStack_588 = (undefined1  [8])(long)iVar1;
    if (auStack_588 == (undefined1  [8])0x0) {
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      auStack_588 = (undefined1  [8])0x0;
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      if (auStack_588 == (undefined1  [8])(long)iVar1) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_001b68ed;
    }
  }
  else {
    run_test_has_ref_cold_1();
  }
  run_test_has_ref_cold_2();
LAB_001b68ed:
  handle_00 = (uv_handle_t *)auStack_588;
  run_test_has_ref_cold_3();
  iVar1 = uv_is_closing(handle_00);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close(handle_00,(uv_close_cb)0x0);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(pipe_ref2) {
  uv_pipe_t h;
  uv_pipe_init(uv_default_loop(), &h, 0);
  uv_listen((uv_stream_t*)&h, 128, (uv_connection_cb)fail_cb);
  uv_unref((uv_handle_t*)&h);
  uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  do_close(&h);
  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}